

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey)

{
  allocator local_51;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,"",&local_51);
  Address(this,type,witness_ver,tree,internal_pubkey,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey)
    : Address(type, witness_ver, tree, internal_pubkey, "") {
  // do nothing
}